

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

ON_ClassArray<ON_FontFaceQuartet> * __thiscall ON_FontList::QuartetList(ON_FontList *this)

{
  ON_ClassArray<ON_FontFaceQuartet> *this_00;
  Member MVar1;
  uint uVar2;
  long lVar3;
  bool bVar4;
  uint j_2;
  ulong uVar5;
  undefined1 *puVar6;
  ON_Font *pOVar7;
  wchar_t *quartet_name_00;
  uint k1;
  uint uVar8;
  uint uVar9;
  ON_Font **ppOVar11;
  int ii;
  ulong uVar12;
  long *plVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  ON_SimpleArray<const_ON_Font_*> *pOVar17;
  ulong uVar18;
  int iVar19;
  long lVar20;
  int j_1;
  ulong uVar21;
  uint uVar22;
  uint uVar23;
  uint j;
  ON_Font *pOVar24;
  ON_Font *pOVar25;
  ON_3udex OVar26;
  int local_954;
  ON_Font *local_950;
  ON_Font *local_948;
  ON_Font *local_940;
  ON_Font *local_938;
  ON_SimpleArray<const_ON_Font_*> *local_930;
  ON_Font *local_928;
  uint local_91c;
  ON_Font *local_918 [4];
  ON_wString quartet_name;
  ON_Font *local_8e8;
  ON_SimpleArray<const_ON_Font_*> bolditalic_faces;
  ON_SimpleArray<const_ON_Font_*> italic_faces;
  ON_SimpleArray<const_ON_Font_*> bold_faces;
  ON_SimpleArray<const_ON_Font_*> regular_faces;
  ON_FontFaceQuartet q;
  ON_Font *upright_faces [2];
  ON_Font *slanted_faces [2];
  ON_wString local_820;
  uint local_818 [4];
  ON__UINT8 local_808 [16];
  double local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  element_type *peStack_7e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_7d8;
  ON_FreeTypeFace *pOStack_7d0;
  long local_7c8 [4];
  long alStack_7a8 [239];
  uint uVar10;
  
  local_930 = ByQuartetName(this);
  this_00 = &this->m_quartet_list;
  if ((this->m_quartet_list).m_count < 1) {
    uVar2 = local_930->m_count;
    ON_ClassArray<ON_FontFaceQuartet>::Reserve(this_00,(ulong)(uVar2 >> 2) + 0x20);
    local_948 = (ON_Font *)0x0;
    ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray(&regular_faces,8);
    ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray(&bold_faces,8);
    ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray(&italic_faces,8);
    ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray(&bolditalic_faces,8);
    pOVar25 = (ON_Font *)0x0;
    local_8e8 = (ON_Font *)0x0;
    while( true ) {
      uVar22 = (uint)pOVar25;
      if (uVar2 <= uVar22) break;
      local_948 = local_930->m_a[(long)pOVar25];
      if (local_948 != (ON_Font *)0x0) {
        ON_Font::QuartetName((ON_Font *)&quartet_name);
        bVar4 = ON_wString::IsEmpty(&quartet_name);
        if (!bVar4) {
          memset(local_7c8,0,0x790);
          local_818._0_8_ = 0;
          local_818._8_8_ = 0;
          local_808[0] = '\0';
          local_808[1] = '\0';
          local_808[2] = '\0';
          local_808[3] = '\0';
          local_808[4] = '\0';
          local_808[5] = '\0';
          local_808[6] = '\0';
          local_808[7] = '\0';
          local_808[8] = '\0';
          local_808[9] = '\0';
          local_808[10] = '\0';
          local_808[0xb] = '\0';
          local_808[0xc] = '\0';
          local_808[0xd] = '\0';
          local_808[0xe] = '\0';
          local_808[0xf] = '\0';
          local_7f8 = 0.0;
          uStack_7f0._0_1_ = Unset;
          uStack_7f0._1_1_ = Unset;
          uStack_7f0._2_2_ = 0;
          uStack_7f0._4_4_ = 0;
          local_7e8 = 0.0;
          peStack_7e0 = (element_type *)0x0;
          local_7d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          pOStack_7d0 = (ON_FreeTypeFace *)0x0;
          if (-1 < regular_faces.m_capacity) {
            regular_faces.m_count = 0;
          }
          if (-1 < bold_faces.m_capacity) {
            bold_faces.m_count = 0;
          }
          if (-1 < italic_faces.m_capacity) {
            italic_faces.m_count = 0;
          }
          if (-1 < bolditalic_faces.m_capacity) {
            bolditalic_faces.m_count = 0;
          }
          upright_faces[0] = (ON_Font *)0x0;
          upright_faces[1] = (ON_Font *)0x0;
          slanted_faces[0] = (ON_Font *)0x0;
          slanted_faces[1] = (ON_Font *)0x0;
          local_928 = (ON_Font *)CONCAT44(local_928._4_4_,1);
          local_940 = pOVar25;
          for (; (local_8e8 = (ON_Font *)(ulong)uVar2, pOVar25 < (ON_Font *)(ulong)uVar2 &&
                 (local_948 = local_930->m_a[(long)pOVar25], local_8e8 = pOVar25,
                 local_948 != (ON_Font *)0x0));
              pOVar25 = (ON_Font *)((long)&pOVar25->m_runtime_serial_number + 1)) {
            ON_Font::QuartetName((ON_Font *)&q);
            bVar4 = ON_wString::EqualOrdinal(&quartet_name,(ON_wString *)&q,true);
            ON_wString::~ON_wString((ON_wString *)&q);
            if (!bVar4) break;
            uVar8 = (uint)local_948->m_managed_installed_font_and_bits & 3;
            if (uVar8 != 2) {
              uVar8 = (uint)local_928;
            }
            if (local_948->m_runtime_serial_number == 0) {
              uVar8 = (uint)local_928;
            }
            local_928 = (ON_Font *)CONCAT44(local_928._4_4_,uVar8);
          }
          pOVar25 = (ON_Font *)((ulong)local_8e8 & 0xffffffff);
          uVar5 = 0;
          uVar23 = 0;
          iVar15 = 0;
          local_954 = 0;
          local_91c = 0;
          uVar21 = 0;
          pOVar17 = local_930;
          local_938 = pOVar25;
          for (uVar8 = 0; pOVar24 = local_940, uVar8 != (uint)local_928; uVar8 = uVar8 + 1) {
            for (; pOVar24 < pOVar25;
                pOVar24 = (ON_Font *)((long)&pOVar24->m_runtime_serial_number + 1)) {
              local_948 = pOVar17->m_a[(long)pOVar24];
              if (local_948 != (ON_Font *)0x0) {
                if ((local_948->m_font_bUnderlined == false) &&
                   (local_948->m_font_bStrikethrough != true)) {
                  if (uVar8 == (((uint)local_948->m_managed_installed_font_and_bits & 3) == 2 &&
                               local_948->m_runtime_serial_number != 0)) {
                    uVar16 = (uint)uVar5;
                    MVar1 = local_948->m_quartet_member;
                    OVar26 = Internal_StretchSlantWeightDex(10,10,local_948);
                    uVar9 = OVar26.k;
                    uVar10 = OVar26.i;
                    if ((0xfffffff6 < uVar10 - 10) && (0xfffffff6 < uVar9 - 10)) {
                      uVar18 = OVar26._0_8_ >> 0x20;
                      uVar12 = (ulong)uVar10;
                      if (local_7c8[uVar12 * 0x16 + uVar18 * 0xb + (ulong)uVar9] == 0) {
                        local_7c8[uVar12 * 0x16 + uVar18 * 0xb + (ulong)uVar9] = (long)local_948;
                        uVar9 = uVar10;
                        if ((local_954 == 0) || (uVar9 = local_91c, uVar10 < (uint)uVar21)) {
                          local_91c = uVar9;
                          uVar21 = (ulong)uVar10;
                        }
                        else if (local_91c <= uVar10) {
                          local_91c = uVar10;
                        }
                        local_818[uVar12 * 2 + uVar18] = local_818[uVar12 * 2 + uVar18] + 1;
                        if (uVar18 == 0) {
                          if (uVar23 < 2) {
                            upright_faces[uVar23] = local_948;
                          }
                          uVar23 = uVar23 + 1;
                        }
                        else if (OVar26.j == 1) {
                          if (uVar16 < 2) {
                            slanted_faces[uVar5] = local_948;
                          }
                          uVar5 = (ulong)(uVar16 + 1);
                        }
                        uVar16 = (uint)uVar5;
                        local_954 = local_954 + 1;
                        if (MVar1 - 1 < 4) {
                          pOVar17 = &bold_faces;
                          switch((uint)MVar1) {
                          case 1:
                            pOVar17 = &regular_faces;
                            break;
                          case 3:
                            pOVar17 = &italic_faces;
                            break;
                          case 4:
                            pOVar17 = &bolditalic_faces;
                          }
                          ON_SimpleArray<const_ON_Font_*>::Append(pOVar17,&local_948);
                          pOVar17 = local_930;
                          pOVar25 = local_938;
                          goto LAB_0049d7c5;
                        }
                      }
                    }
                    uVar5 = (ulong)uVar16;
                    pOVar17 = local_930;
                    pOVar25 = local_938;
                  }
                }
                else {
                  iVar15 = iVar15 + 1;
                }
              }
LAB_0049d7c5:
            }
          }
          if (local_954 != 0) {
            local_918[2] = (ON_Font *)0x0;
            local_918[3] = (ON_Font *)0x0;
            local_918[0] = (ON_Font *)0x0;
            local_918[1] = (ON_Font *)0x0;
            pOVar25 = (ON_Font *)(ulong)(uint)bold_faces.m_count;
            if ((local_954 ==
                 italic_faces.m_count + bolditalic_faces.m_count + bold_faces.m_count +
                 regular_faces.m_count) &&
               ((uint)(italic_faces.m_count | bolditalic_faces.m_count |
                      bold_faces.m_count | regular_faces.m_count) < 2)) {
              if (regular_faces.m_count == 1) {
                local_918[0] = *regular_faces.m_a;
              }
              else {
                local_918[0] = (ON_Font *)0x0;
              }
              if (bold_faces.m_count == 1) {
                local_918[1] = *bold_faces.m_a;
                pOVar25 = (ON_Font *)bold_faces.m_a;
              }
              else {
                local_918[1] = (ON_Font *)0x0;
              }
              if (italic_faces.m_count == 1) {
                local_918[2] = *italic_faces.m_a;
              }
              else {
                local_918[2] = (ON_Font *)0x0;
              }
              if (bolditalic_faces.m_count == 1) {
                local_918[3] = *bolditalic_faces.m_a;
              }
              else {
                local_918[3] = (ON_Font *)0x0;
              }
            }
            else if ((uVar23 < 3) &&
                    (((local_954 == uVar23 + (uint)uVar5 && ((uint)uVar5 < 3)) &&
                     ((uint)uVar21 == local_91c)))) {
              local_918[2] = slanted_faces[0];
              local_918[3] = slanted_faces[1];
              local_918[0] = upright_faces[0];
              local_918[1] = upright_faces[1];
            }
            else {
              if ((uint)uVar21 < local_91c) {
                uVar5 = 4;
                uVar18 = 6;
                uVar21 = 5;
                do {
                  if (uVar18 != 10) {
                    if (uVar18 == 0xb) break;
                    uVar12 = uVar5 & 0xffffffff;
                    if (local_818[uVar5 * 2 + 1] + local_818[uVar5 * 2] <=
                        local_818[uVar21 * 2 + 1] + local_818[uVar21 * 2]) {
                      uVar12 = uVar21;
                    }
                    uVar21 = uVar18 & 0xffffffff;
                    if (local_818[uVar18 * 2 + 1] + local_818[uVar18 * 2] <=
                        local_818[uVar12 * 2 + 1] + local_818[uVar12 * 2]) {
                      uVar21 = uVar12;
                    }
                  }
                  uVar18 = uVar18 + 1;
                  uVar5 = uVar5 - 1;
                } while( true );
              }
              if (((int)uVar21 - 10U < 0xfffffff7) ||
                 (local_818[uVar21 * 2] + local_818[uVar21 * 2 + 1] == 0)) goto LAB_0049e04e;
              plVar13 = local_7c8 + uVar21 * 0x16;
              for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
                if (local_818[uVar21 * 2 + lVar14] < 3) {
                  iVar19 = 0;
                  uVar5 = 1;
                  while ((uVar5 < 10 && (iVar19 < 2))) {
                    if ((ON_Font *)plVar13[uVar5] != (ON_Font *)0x0) {
                      lVar20 = (long)iVar19;
                      iVar19 = iVar19 + 1;
                      local_918[lVar14 * 2 + lVar20] = (ON_Font *)plVar13[uVar5];
                    }
                    uVar5 = uVar5 + 1;
                  }
                }
                else {
                  uVar5 = (ulong)((alStack_7a8[uVar21 * 0x16 + lVar14 * 0xb] == 0) + 4);
                  uVar8 = (alStack_7a8[uVar21 * 0x16 + lVar14 * 0xb] == 0) + 3;
                  do {
                    uVar10 = uVar8;
                    uVar18 = uVar5;
                    uVar23 = (uint)uVar18;
                    lVar20 = local_7c8[uVar21 * 0x16 + lVar14 * 0xb + (uVar18 & 0xffffffff)];
                    if (uVar23 == 0) break;
                    uVar5 = uVar18 - 1;
                    uVar8 = uVar10 - 1;
                  } while (lVar20 == 0);
                  uVar5 = uVar18 + 1;
                  if (alStack_7a8[uVar21 * 0x16 + lVar14 * 0xb + 3] != 0) {
                    uVar5 = 7;
                  }
                  uVar8 = (int)uVar5 - 1;
                  do {
                    uVar9 = uVar8;
                    lVar3 = plVar13[uVar5];
                    uVar8 = uVar9 + 1;
                    if (9 < uVar5) break;
                    uVar5 = uVar5 + 1;
                  } while (lVar3 == 0);
                  if ((lVar20 == 0) || (lVar3 != 0)) {
                    if ((lVar20 == 0) && (lVar3 != 0)) {
                      do {
                        uVar5 = (ulong)uVar9;
                        bVar4 = uVar9 == 0;
                        uVar9 = uVar9 - 1;
                        if (bVar4) goto LAB_0049dbee;
                        uVar23 = uVar8;
                      } while (local_7c8[uVar21 * 0x16 + lVar14 * 0xb + uVar5] == 0);
                      goto LAB_0049dbdf;
                    }
                  }
                  else if (uVar23 == 0) {
                    uVar18 = 0;
                  }
                  else {
                    do {
                      uVar5 = (ulong)uVar10;
                      uVar9 = uVar10 - 1;
                      if (uVar10 == 0) goto LAB_0049dbee;
                      uVar10 = uVar9;
                    } while (local_7c8[uVar21 * 0x16 + lVar14 * 0xb + uVar5] == 0);
LAB_0049dbdf:
                    uVar8 = uVar23;
                    uVar18 = (ulong)(uVar9 + 1);
                  }
LAB_0049dbee:
                  local_918[lVar14 * 2] =
                       (ON_Font *)local_7c8[uVar21 * 0x16 + lVar14 * 0xb + (uVar18 & 0xffffffff)];
                  local_918[lVar14 * 2 + 1] =
                       (ON_Font *)local_7c8[uVar21 * 0x16 + lVar14 * 0xb + (ulong)uVar8];
                }
                plVar13 = plVar13 + 0xb;
              }
              pOVar25 = (ON_Font *)0x2;
            }
            if (local_918[0] == (ON_Font *)0x0 && local_918[1] == (ON_Font *)0x0) {
              local_918[0] = local_918[2];
              local_918[1] = local_918[3];
              local_918[2] = (ON_Font *)0x0;
              local_918[3] = (ON_Font *)0x0;
            }
            if (local_918[0] == (ON_Font *)0x0 && local_918[2] == (ON_Font *)0x0) {
              local_918[0] = local_918[1];
              local_918[2] = local_918[3];
              local_918[1] = (ON_Font *)0x0;
              local_918[3] = (ON_Font *)0x0;
            }
            pOVar24 = local_918[0];
            puVar6 = &DAT_006b3130;
            ppOVar11 = local_918;
            for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
              for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
                pOVar25 = ppOVar11[lVar20];
                if (pOVar25 != (ON_Font *)0x0) {
                  if ((pOVar25->m_quartet_member == Unset) ||
                     ((pOVar25->m_quartet_member != puVar6[lVar20] &&
                      (pOVar25->m_font_type != InstalledFont)))) {
                    pOVar25->m_quartet_member = puVar6[lVar20];
                  }
                }
              }
              ppOVar11 = ppOVar11 + 2;
              puVar6 = puVar6 + 2;
            }
            local_950 = local_918[3];
            local_948 = pOVar25;
            for (pOVar7 = local_940; pOVar7 < local_938;
                pOVar7 = (ON_Font *)((long)&pOVar7->m_runtime_serial_number + 1)) {
              local_948 = local_930->m_a[(long)pOVar7];
              if ((((local_948 != local_918[3] &&
                     ((local_948 != local_918[2] && local_948 != local_918[1]) &&
                     (local_948 != local_918[0] && local_948 != (ON_Font *)0x0))) &&
                   (local_948->m_font_bUnderlined == false)) &&
                  (local_948->m_font_bStrikethrough == false)) &&
                 ((local_948->m_quartet_member != Unset && (local_948->m_font_type == InstalledFont)
                  ))) {
                local_948->m_quartet_member = Unset;
              }
            }
            pOVar25 = local_940;
            local_940 = local_918[1];
            local_928 = local_918[2];
            if (iVar15 != 0) {
              for (; pOVar25 < local_938;
                  pOVar25 = (ON_Font *)((long)&pOVar25->m_runtime_serial_number + 1)) {
                local_948 = local_930->m_a[(long)pOVar25];
                if ((local_948 != (ON_Font *)0x0) &&
                   ((local_948->m_font_bUnderlined != false ||
                    (local_948->m_font_bStrikethrough == true)))) {
                  OVar26 = Internal_StretchSlantWeightDex(10,10,local_948);
                  if (((OVar26.k - 1 < 9 && OVar26.i - 1 < 9) && OVar26._0_8_ >> 0x21 == 0) &&
                     (local_7c8[(ulong)OVar26.i * 0x16 + (ulong)OVar26.k * 0xc] != 0)) {
                    local_948->m_quartet_member =
                         *(Member *)
                          (local_7c8[(ulong)OVar26.i * 0x16 + (ulong)OVar26.k * 0xc] + 0x91);
                  }
                }
              }
            }
            ppOVar11 = local_918;
            local_938 = pOVar24;
            for (lVar14 = 0; lVar14 != 2; lVar14 = lVar14 + 1) {
              for (lVar20 = 0; lVar20 != 2; lVar20 = lVar20 + 1) {
                local_948 = ppOVar11[lVar20];
                if ((((local_948 != (ON_Font *)0x0) && (local_948->m_font_type != InstalledFont)) &&
                    (((uint)local_948->m_managed_installed_font_and_bits & 3) != 2 &&
                     local_948->m_runtime_serial_number != 0)) &&
                   (((local_948->m_font_bUnderlined == false &&
                     (local_948->m_font_bStrikethrough == false)) &&
                    ((pOVar25 = (ON_Font *)
                                (local_948->m_managed_installed_font_and_bits & 0xfffffffffffffffc),
                     pOVar25 != (ON_Font *)0x0 && (bVar4 = ON_Font::IsInstalledFont(pOVar25), bVar4)
                     ))))) {
                  ON_Font::QuartetName((ON_Font *)&q);
                  bVar4 = ON_wString::EqualOrdinal(&quartet_name,(ON_wString *)&q,true);
                  ON_wString::~ON_wString((ON_wString *)&q);
                  if (bVar4) {
                    ON_Font::InstalledFontQuartet(&q,pOVar25);
                    ON_wString::ON_wString(&local_820,(ON_wString *)&q);
                    bVar4 = ON_wString::EqualOrdinal(&quartet_name,&local_820,true);
                    ON_wString::~ON_wString(&local_820);
                    if (bVar4) {
                      if (q.m_regular != (ON_Font *)0x0) {
                        local_918[0] = q.m_regular;
                        local_938 = q.m_regular;
                      }
                      if (q.m_bold != (ON_Font *)0x0) {
                        local_918[1] = q.m_bold;
                        local_940 = q.m_bold;
                      }
                      if (q.m_italic != (ON_Font *)0x0) {
                        local_918[2] = q.m_italic;
                        local_928 = q.m_italic;
                      }
                      if (q.m_bold_italic != (ON_Font *)0x0) {
                        local_918[3] = q.m_bold_italic;
                        local_950 = q.m_bold_italic;
                      }
                    }
                    ON_wString::~ON_wString(&q.m_quartet_name);
                  }
                }
              }
              ppOVar11 = ppOVar11 + 2;
            }
            quartet_name_00 = ON_wString::operator_cast_to_wchar_t_(&quartet_name);
            ON_FontFaceQuartet::ON_FontFaceQuartet
                      (&q,quartet_name_00,local_938,local_940,local_928,local_950);
            bVar4 = ON_FontFaceQuartet::IsEmpty(&q);
            if (!bVar4) {
              ON_ClassArray<ON_FontFaceQuartet>::Append(this_00,&q);
            }
            ON_wString::~ON_wString(&q.m_quartet_name);
          }
        }
LAB_0049e04e:
        ON_wString::~ON_wString(&quartet_name);
      }
      uVar8 = uVar22 + 1;
      if (uVar22 < (uint)local_8e8) {
        uVar8 = (uint)local_8e8;
      }
      pOVar25 = (ON_Font *)(ulong)uVar8;
    }
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&bolditalic_faces);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&italic_faces);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&bold_faces);
    ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&regular_faces);
  }
  return this_00;
}

Assistant:

const ON_ClassArray< ON_FontFaceQuartet >& ON_FontList::QuartetList() const
{
  // call ByQuartetName() first to insure m_quartet_list[] is set correctly.
  const ON_SimpleArray<const ON_Font*>& a = this->ByQuartetName();
  
  if (m_quartet_list.Count() > 0)
    return m_quartet_list;

  const unsigned int font_count = a.UnsignedCount();
  m_quartet_list.Reserve(32 + font_count / 4);

  const ON_Font* f = nullptr;
  const unsigned max_stretch_dex = 10;
  const unsigned max_weight_dex = 10;

  // fonts_by_ssw[stretch_dex][upright,italic][weight_dex]
  // = all fonts with the same quartet name arranged by stretch, slant, and weight.
  const ON_Font* fonts_by_ssw[11][2][11] = {};

  // weight_count[stretch_dex][upright,italic] = number of weights available for that stretch and slant
  unsigned int weight_count[10][2] = {};

  // stretch values range from min stretch = stretch_dex_range[0] to max stretch = stretch_dex_range[1].
  unsigned stretch_dex_range[2] = { 0U,0U };

  // Fonts with stretch < medium_stretch_dex are "compressed"
  // Fonts with stretch > medium_stretch_dex are "expanded"
  // When we have multiple candidates to choose from, we opt for ones closest to medium.
  const unsigned medium_stretch_dex = (unsigned)static_cast<unsigned char>(ON_Font::Stretch::Medium);

  ON_SimpleArray<const ON_Font*> regular_faces(8);
  ON_SimpleArray<const ON_Font*> bold_faces(8);
  ON_SimpleArray<const ON_Font*> italic_faces(8);
  ON_SimpleArray<const ON_Font*> bolditalic_faces(8);

  unsigned next_i = 0U;
  for (unsigned i = 0; i < font_count; i = (i < next_i) ? next_i : (i+1))
  {
    f = a[i];
    if (nullptr == f)
      continue;

    const ON_wString quartet_name = f->QuartetName();
    if (quartet_name.IsEmpty())
      continue;

    // fonts_by_ssw_count = total number of undecorated fonts with the same QuartetName()
    unsigned fonts_by_ssw_count = 0;

    // total number of fonts with underline or striketrough rendering effects enabled.
    unsigned decorated_fonts_count = 0;

    // fonts_by_ssw[][][] = all the "clean" fonts with the same quartet name sorted by stretch-slant-weight
    memset(fonts_by_ssw, 0, sizeof(fonts_by_ssw));
    memset(weight_count, 0, sizeof(weight_count));
    memset(stretch_dex_range, 0, sizeof(stretch_dex_range));
    regular_faces.SetCount(0);
    bold_faces.SetCount(0);
    italic_faces.SetCount(0);
    bolditalic_faces.SetCount(0);

    unsigned int upright_face_count = 0;
    unsigned int slanted_face_count = 0;
    const ON_Font* upright_faces[2] = {}; // room to save up to 2 upright faces
    const ON_Font* slanted_faces[2] = {}; // room to save up to 2 slanted faces

    // This for() loop sets the array limits for the fonts with the same quartet name
    // and determines how many passes are needed (substitutes are ignored in favor of
    // non substitutes).
    unsigned pass_count = 1;
    for (next_i = i; next_i < font_count; ++next_i)
    {
      f = a[next_i];
      if (nullptr == f)
        break;
      if (false == quartet_name.EqualOrdinal(f->QuartetName(), true))
        break; // f has a different quartet name - we're done getting the fonts in this quartet
      if (f->IsManagedSubstitutedFont())
        pass_count = 2;
    }
    
    // This for() loop gets all the fonts with the same QuartetName() and puts them in fonts_by_ssw[][][]. 
    // While doing that it get ranges of values stretch, counts the number of fonts that have each weight, ...
    for ( unsigned pass = 0; pass < pass_count; ++pass) for ( unsigned j = i; j < next_i; ++j)
    {
      f = a[j];
      if (nullptr == f)
        continue;
      if (f->IsUnderlined() || f->IsStrikethrough())
      {
        // these are rendering effects and we should have a "clean" version in this list too
        ++decorated_fonts_count;
        continue; 
      }
      if (pass != (f->IsManagedSubstitutedFont() ? 1U : 0U))
        continue;

      const ON_FontFaceQuartet::Member fm = f->m_quartet_member;

      // use f's stretch-slant-weight to add it to the fonts_by_ssw[][][] array.
      const ON_3udex ssw_dex = Internal_StretchSlantWeightDex(max_stretch_dex, max_weight_dex, f);

      const unsigned stretch_dex = ssw_dex.i;
      if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
        continue;

      const unsigned slant_dex = ssw_dex.j;

      const unsigned weight_dex = ssw_dex.k;
      if (weight_dex < 1 || weight_dex >= max_weight_dex)
        continue;

      if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][weight_dex])
      {
        // We already found one font with he same quartet name, stretch, slant, and weight.
        // The first one wins and that's why we use two passes when substitute fonts are involved.
        continue;
      }

      ++fonts_by_ssw_count;
      fonts_by_ssw[stretch_dex][slant_dex][weight_dex] = f;

      // add this font's stretch, weight, and slant to the tally for this quartet name.
      if (1 == fonts_by_ssw_count)
      {
        stretch_dex_range[0] = stretch_dex;
        stretch_dex_range[1] = stretch_dex;
      }
      else if (stretch_dex < stretch_dex_range[0])
        stretch_dex_range[0] = stretch_dex;
      else if (stretch_dex > stretch_dex_range[1])
        stretch_dex_range[1] = stretch_dex;

      ++weight_count[stretch_dex][slant_dex];

      if (0 == slant_dex)
      {
        if (upright_face_count < 2)
          upright_faces[upright_face_count] = f;
        ++upright_face_count;
      }
      else if (1 == slant_dex)
      {
        if (slanted_face_count < 2)
          slanted_faces[slanted_face_count] = f;
        ++slanted_face_count;
      }

      // if f's role in the quartet is known, add it to the appropriate x_faces[] array.
      switch (fm)
      {
      case ON_FontFaceQuartet::Member::Regular:
        regular_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Bold:
        bold_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Italic:
        italic_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::BoldItalic:
        bolditalic_faces.Append(f);
        break;
      case ON_FontFaceQuartet::Member::Unset:
        break;
      };
    }

    // fonts_by_ssw_count = number of usable fonts with the same quartet name.
    // Pointers to these fonts are someplace in the fonts_by_ssw[][][] array.
    if (0 == fonts_by_ssw_count)
      continue; // nothing usable

    // The goal is to look at the fonts in fonts_by_ssw[][][] and select
    // the best choice for a rich text quartet (which may have 1 to 4 faces).
    const ON_Font* quartet_faces[2][2] = {};
    bool bHaveQuartetFaces = false;

    const unsigned regular_count = regular_faces.UnsignedCount();
    const unsigned bold_count = bold_faces.UnsignedCount();
    const unsigned italic_count = italic_faces.UnsignedCount();
    const unsigned bolditalic_count = bolditalic_faces.UnsignedCount();
    if (
      fonts_by_ssw_count == (regular_count + bold_count + italic_count + bolditalic_count)
      && regular_count <= 1 && bold_count <= 1 && italic_count <= 1 && bolditalic_count <= 1)
    {
      // Best case - every font with this quartet name knows the role it plays in the quartet and there are no contradictions.
      quartet_faces[0][0] = 1 == regular_count ? regular_faces[0] : nullptr;
      quartet_faces[0][1] = 1 == bold_count ? bold_faces[0] : nullptr;
      quartet_faces[1][0] = 1 == italic_count ? italic_faces[0] : nullptr;
      quartet_faces[1][1] = 1 == bolditalic_count ? bolditalic_faces[0] : nullptr;
      bHaveQuartetFaces = true;
    }
    else if (fonts_by_ssw_count == upright_face_count + slanted_face_count
      && upright_face_count <= 2
      && slanted_face_count <= 2
      && stretch_dex_range[0] == stretch_dex_range[1]
      )
    {
      if (2 == upright_face_count && ON_Font::CompareWeight(upright_faces[0]->FontWeight(), upright_faces[1]->FontWeight()) > 0)
      {
        f = upright_faces[0];
        upright_faces[0] = upright_faces[1];
        upright_faces[1] = f;
      }
      if (2 == slanted_face_count && ON_Font::CompareWeight(slanted_faces[0]->FontWeight(), slanted_faces[1]->FontWeight()) > 0)
      {
        f = slanted_faces[0];
        slanted_faces[0] = slanted_faces[1];
        slanted_faces[1] = f;
      }
      quartet_faces[0][0] = upright_faces[0];
      quartet_faces[0][1] = upright_faces[1];
      quartet_faces[1][0] = slanted_faces[0];
      quartet_faces[1][1] = slanted_faces[1];
      bHaveQuartetFaces = true;
    }

    if (false == bHaveQuartetFaces)
    {
      // 1. Most Windows installed fonts have the Windows LOGFONT name reliably set
      // from Windows LOGFONT information when we create installed ON_Fonts from 
      // DirectWrite fonts in opennurbs_win_dwrite.cpp. The Windows LOGFONTs partition
      // families into quartets. These end up with bUsePairCandidate = true.
      // 
      // 2. In rare cases on Windows, font foundaries or authors fail to specify a LOGFONT name
      // in the ttc / ttf / postscript / ... file. 
      // If we are able to make a reasonable guess, then we set the member here.
      // 
      // 3. Apple installed fonts are created from CTFont in opennurbs_apple_nsfont.cpp
      // and the LOGFONT information from ttc / ttf / postscript files cannot be retrieved.
      // There are no Mac OS tools that reliably paritition large font families into
      // quartets.
      // 
      // 4. Missing fonts that are created in ON_Font::FontFromRichTextProperties() have the quartet
      // member set to the specified rich text regular/bold/italic/bold-italic property.
      //
      // Attempt to find something usable in this mess ...

      unsigned stretch_dex = medium_stretch_dex;
      if (stretch_dex_range[0] < stretch_dex_range[1])
      {
        // Need to pick the stretch_dex with the most members.
        // This happens on Mac OS (where no reliable "LOGFONT" name exists) and
        // with damaged Windows fonts that don't have a "LOFGONT" name set.
        // Pick the one closest to ON_Font::Stretch::Medium with the most faces        
        for (unsigned k = 1; k <= medium_stretch_dex; ++k)
        {
          const unsigned k0 = medium_stretch_dex - k;
          const unsigned k1 = medium_stretch_dex + k;
          if (k0 > 0 && (weight_count[k0][0] + weight_count[k0][1]) > (weight_count[stretch_dex][0] + weight_count[stretch_dex][1]))
            stretch_dex = k0;
          if (k1 < max_stretch_dex && (weight_count[k1][0] + weight_count[k1][1]) >(weight_count[stretch_dex][0] + weight_count[stretch_dex][1]))
            stretch_dex = k1;
        }
      }
      else
      {
        stretch_dex = stretch_dex_range[0];
      }
      if (stretch_dex < 1 || stretch_dex >= max_stretch_dex)
        continue;

      if (weight_count[stretch_dex][0] + weight_count[stretch_dex][1] <= 0)
        continue;

      const unsigned normal_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Normal);
      const unsigned medium_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Medium);
      const unsigned bold_weight_dex = (unsigned)static_cast<unsigned char>(ON_Font::Weight::Bold);

      for (unsigned slant_dex = 0; slant_dex < 2; slant_dex++)
      {
        if (weight_count[stretch_dex][slant_dex] <= 2)
        {
          // 0, 1 or 2 available weights.
          // If there is 1 face it must be the "Regular" face.
          // If there are 2 faces, the lightest will be "Regular" and the heaviest will be bold.
          int pair_dex = 0;
          for (int j = 1; j < max_weight_dex && pair_dex < 2; ++j)
          {
            if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][j])
              quartet_faces[slant_dex][pair_dex++] = fonts_by_ssw[stretch_dex][slant_dex][j];
          }
          continue;
        }

        // 3 or more available weights (Bahnshrift, Helvetica Neue, ...)
        unsigned regular_dex
          = (nullptr != fonts_by_ssw[stretch_dex][slant_dex][normal_weight_dex])
          ? normal_weight_dex
          : medium_weight_dex;
        while (nullptr == fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && regular_dex > 0)
          --regular_dex;

        unsigned bold_dex
          = (nullptr != fonts_by_ssw[stretch_dex][slant_dex][bold_weight_dex])
          ? bold_weight_dex
          : regular_dex + 1;
        while (nullptr == fonts_by_ssw[stretch_dex][slant_dex][bold_dex] && bold_dex < max_weight_dex)
          ++bold_dex;

        if (nullptr != fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && nullptr == fonts_by_ssw[stretch_dex][slant_dex][bold_dex])
        {
          if (regular_dex > 0)
          {
            for (unsigned j = regular_dex - 1; j > 0; --j)
            {
              if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][j])
                continue;
              bold_dex = regular_dex;
              regular_dex = j;
              break;
            }
          }
        }
        else if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][regular_dex] && nullptr != fonts_by_ssw[stretch_dex][slant_dex][bold_dex])
        {
          if (bold_dex > 0)
          {
            for (unsigned j = bold_dex - 1; j > 0; --j)
            {
              if (nullptr == fonts_by_ssw[stretch_dex][slant_dex][j])
                continue;
              regular_dex = j;
              break;
            }
          }
        }

        quartet_faces[slant_dex][0] = fonts_by_ssw[stretch_dex][slant_dex][regular_dex];
        quartet_faces[slant_dex][1] = fonts_by_ssw[stretch_dex][slant_dex][bold_dex];
      }
    }

    if (nullptr == quartet_faces[0][0] && nullptr == quartet_faces[0][1])
    {
      // Fonts like Monotype Corsiva have only slanted faces.
      // A quartet name + regular/bold/italic/italic-bold user interface should offer
      // a regular and bold member in this situation.
      quartet_faces[0][0] = quartet_faces[1][0];
      quartet_faces[0][1] = quartet_faces[1][1];
      quartet_faces[1][0] = nullptr;
      quartet_faces[1][1] = nullptr;
    }

    if (nullptr == quartet_faces[0][0] && nullptr == quartet_faces[1][0])
    {
      // This might happen if buggy code encounters a heavy font like Arial Black
      // and incorrectly specifies the heavy regular/italic faces as bold.
      // A quartet name + regular/bold/italic/italic-bold user interface should offer
      // a regular and italic member in this situation.
      quartet_faces[0][0] = quartet_faces[0][1];
      quartet_faces[1][0] = quartet_faces[1][1];
      quartet_faces[0][1] = nullptr;
      quartet_faces[1][1] = nullptr;
    }

    // If ON_Font.m_quartet_member is not set or set incorrectly, 
    // then set it now so we get consistent answers going forward.
    // (Managed quartets are recomputed as new missing fonts are added and in complex cases, the quartet member can change).
    // Installed font quartet members are set once and never change.
    const ON_FontFaceQuartet::Member member[2][2] = {
      {ON_FontFaceQuartet::Member::Regular,ON_FontFaceQuartet::Member::Bold},
      {ON_FontFaceQuartet::Member::Italic,ON_FontFaceQuartet::Member::BoldItalic}
    };
    for (int ii = 0; ii < 2; ++ii) for (int jj = 0; jj < 2; ++jj)
    {
      f = quartet_faces[ii][jj];
      if (nullptr != f)
      {
        const ON_FontFaceQuartet::Member m = f->m_quartet_member;
        if (ON_FontFaceQuartet::Member::Unset == m)
          f->m_quartet_member = member[ii][jj];
        else if (m != member[ii][jj])
        {
          if (ON_Font::FontType::InstalledFont != f->m_font_type)
            quartet_faces[ii][jj]->m_quartet_member = member[ii][jj];
        }
      }
    }

    // Unset the m_quartet_member on unsed fonts with this quartet name.
    for (unsigned j = i; j < next_i; ++j)
    {
      f = a[j];
      if (nullptr == f)
        continue;
      if (f == quartet_faces[0][0] || f == quartet_faces[0][1] || f == quartet_faces[1][0] || f == quartet_faces[1][1])
        continue;
      if (f->IsUnderlined() || f->IsStrikethrough())
        continue; // dealt with below

      const ON_FontFaceQuartet::Member fm = f->m_quartet_member;
      if (ON_FontFaceQuartet::Member::Unset == fm)
        continue;
      if (ON_Font::FontType::InstalledFont != f->m_font_type)
        continue;

      // m_quartet_member incorrectly set. 
      // If you are debugging and this is causing a problem, the bug is not here; 
      // it is in the code above that fills in quartet_faces[][].
      f->m_quartet_member = ON_FontFaceQuartet::Member::Unset;
    }

    if (decorated_fonts_count > 0)
    {
      // This for() loop copies the clean font quartet settings to decorated  (underlined and strikethrough) fonts
      for (unsigned j = i; j < next_i; ++j)
      {
        f = a[j];
        if (nullptr == f)
          continue;
        if (false == f->IsUnderlined() && false == f->IsStrikethrough())
          continue;

        // f is underlined or strikethrough - find the clean version in fonts_by_ssw[][][]
        const ON_3udex ssw_dex = Internal_StretchSlantWeightDex(max_stretch_dex, max_weight_dex, f);
        const ON_Font* cleanf = (
          ssw_dex.i >= 1 && ssw_dex.i < max_stretch_dex
          && ssw_dex.j >= 0 && ssw_dex.j < 2
          && ssw_dex.k >= 1 && ssw_dex.k < max_weight_dex
          )
          ? fonts_by_ssw[ssw_dex.i][ssw_dex.k][ssw_dex.k]
          : nullptr;
        if (nullptr != cleanf)
        {
          const ON_FontFaceQuartet::Member fm = cleanf->m_quartet_member;
          f->m_quartet_member = fm;
        }
      }
    }

    // Now convert managed to installed when that makes sense.
    for (int ii = 0; ii < 2; ++ii) for (int jj = 0; jj < 2; ++jj)
    {
      f = quartet_faces[ii][jj];
      if (nullptr == f)
        continue;
      if (ON_Font::FontType::InstalledFont == f->m_font_type)
        continue;
      if (f->IsManagedSubstitutedFont())
        continue; // common - f is a managed font that is missing from this device.

      if (false == f->IsManagedFont())
        continue; // troubling situation ...
      if (f->IsUnderlined() || f->IsStrikethrough())
        continue; // troubling situation ... 

      // There are 2 lists of fonts.
      // All installed fonts - this list is made once when an application starts.
      // Managed fonts - this list grows as an application needs fonts
      // and is used to handle missing fonts and fonts with effects like underlined and strikethrough.
      // 
      // This is a case where a managed font, like ON_Font::Default, 
      // the default engraving font, 
      // and more complicated cases that arise is rich text parsing, 
      // has an identical font that is installed.
      const ON_Font* installed_font = f->Internal_ManagedFontToInstalledFont();
      if (nullptr == installed_font)
        continue;
      if (false == installed_font->IsInstalledFont())
        continue; // bad mojo happened sometime earlier in the life of this app instance.
      if (false == quartet_name.EqualOrdinal(installed_font->QuartetName(), true))
        continue; // troubling situation ...

      // It is often the case that the installed quartet has faces not in the managed font list.
      // ON_Font::Default is a good example. 
      // If there 
      ON_FontFaceQuartet installed_font_quartet = installed_font->InstalledFontQuartet();
      if (false == quartet_name.EqualOrdinal(installed_font_quartet.QuartetName(), true))
        continue;

      if (installed_font_quartet.HasRegularFace())
        quartet_faces[0][0] = installed_font_quartet.RegularFace();
      if (installed_font_quartet.HasBoldFace())
        quartet_faces[0][1] = installed_font_quartet.BoldFace();
      if (installed_font_quartet.HasItalicFace())
        quartet_faces[1][0] = installed_font_quartet.ItalicFace();
      if (installed_font_quartet.HasBoldItalicFace())
        quartet_faces[1][1] = installed_font_quartet.BoldItalicFace();
    }

    const ON_FontFaceQuartet q(quartet_name, quartet_faces[0][0], quartet_faces[0][1], quartet_faces[1][0], quartet_faces[1][1]);
    if (q.IsEmpty())
      continue;

    m_quartet_list.Append(q);
  }

  return m_quartet_list;
}